

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O2

string * __thiscall
cnn::Reshape::as_string
          (string *__return_storage_ptr__,Reshape *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arg_names)

{
  ostream *poVar1;
  ostringstream s;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
  poVar1 = std::operator<<((ostream *)&s,"reshape(");
  poVar1 = std::operator<<(poVar1,(string *)
                                  (arg_names->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
  poVar1 = std::operator<<(poVar1," --> ");
  poVar1 = operator<<(poVar1,&this->to);
  std::operator<<(poVar1,')');
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

string Reshape::as_string(const vector<string>& arg_names) const {
  ostringstream s;
  s << "reshape(" << arg_names[0] << " --> " << to << ')';
  return s.str();
}